

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O2

int avro::parsing::ResolvingGrammarGenerator::bestBranch(NodePtr *writer,NodePtr *reader)

{
  Type TVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Type TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong unaff_RBP;
  size_t j;
  ulong uVar8;
  NodePtr r;
  shared_ptr<avro::Node> local_40;
  
  TVar1 = writer->px->type_;
  iVar4 = (*reader->px->_vptr_Node[4])();
  uVar8 = 0;
  do {
    if (CONCAT44(extraout_var,iVar4) == uVar8) {
      unaff_RBP = 0;
      goto LAB_00163189;
    }
    iVar5 = (*reader->px->_vptr_Node[5])(reader->px,uVar8 & 0xffffffff);
    r.px = *(element_type **)CONCAT44(extraout_var_00,iVar5);
    r.pn.pi_ = (sp_counted_base *)((long *)CONCAT44(extraout_var_00,iVar5))[1];
    if (r.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (r.pn.pi_)->use_count_ = (r.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    TVar6 = (r.px)->type_;
    if (TVar6 == AVRO_NUM_TYPES) {
      resolveSymbol((avro *)&local_40,&r);
      boost::shared_ptr<avro::Node>::operator=(&r,&local_40);
      boost::detail::shared_count::~shared_count(&local_40.pn);
      TVar6 = (r.px)->type_;
    }
    bVar2 = true;
    if (TVar1 == TVar6) {
      iVar5 = (*(r.px)->_vptr_Node[2])();
      if ((char)iVar5 != '\0') {
        iVar5 = (*(r.px)->_vptr_Node[3])();
        iVar7 = (*writer->px->_vptr_Node[3])();
        bVar3 = Name::operator==((Name *)CONCAT44(extraout_var_01,iVar5),
                                 (Name *)CONCAT44(extraout_var_02,iVar7));
        if (!bVar3) goto LAB_0016315f;
      }
      bVar2 = false;
      unaff_RBP = uVar8 & 0xffffffff;
    }
LAB_0016315f:
    boost::detail::shared_count::~shared_count(&r.pn);
    uVar8 = uVar8 + 1;
  } while (bVar2);
LAB_001631ca:
  return (int)unaff_RBP;
LAB_00163189:
  if (CONCAT44(extraout_var,iVar4) == unaff_RBP) goto LAB_001631c7;
  iVar5 = (*reader->px->_vptr_Node[5])(reader->px,unaff_RBP & 0xffffffff);
  iVar5 = *(int *)(*(long *)CONCAT44(extraout_var_03,iVar5) + 8);
  if ((uint)(TVar1 + ~AVRO_INT) < 2) {
    if (iVar5 == 5) goto LAB_001631ca;
  }
  else if ((TVar1 == AVRO_INT) && (iVar5 - 3U < 3)) goto LAB_001631ca;
  unaff_RBP = unaff_RBP + 1;
  goto LAB_00163189;
LAB_001631c7:
  unaff_RBP = 0xffffffff;
  goto LAB_001631ca;
}

Assistant:

int ResolvingGrammarGenerator::bestBranch(const NodePtr& writer,
    const NodePtr& reader)
{
    Type t = writer->type();

    const size_t c = reader->leaves();
    for (size_t j = 0; j < c; ++j) {
        NodePtr r = reader->leafAt(j);
        if (r->type() == AVRO_SYMBOLIC) {
            r = resolveSymbol(r);
        }
        if (t == r->type()) {
            if (r->hasName()) {
                if (r->name() == writer->name()) {
                    return j;
                }
            } else {
                return j;
            }
        }
    }

    for (size_t j = 0; j < c; ++j) {
        const NodePtr& r = reader->leafAt(j);
        Type rt = r->type();
        switch (t) {
        case AVRO_INT:
            if (rt == AVRO_LONG || rt == AVRO_DOUBLE || rt == AVRO_FLOAT) {
                return j;
            }
            break;
        case AVRO_LONG:
        case AVRO_FLOAT:
            if (rt == AVRO_DOUBLE) {
                return j;
            }
            break;
        default:
            break;
        }
    }
    return -1;
}